

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

size_t __thiscall caffe::ParamSpec::ByteSizeLong(ParamSpec *this)

{
  bool bVar1;
  ParamSpec_DimCheckMode value;
  int iVar2;
  UnknownFieldSet *unknown_fields;
  string *value_00;
  size_t sVar3;
  size_t sStack_38;
  int cached_size;
  size_t total_size;
  ParamSpec *this_local;
  
  sStack_38 = 0;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = ParamSpec::unknown_fields(this);
    sStack_38 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  if (((this->_has_bits_).has_bits_[0] & 0xf) != 0) {
    bVar1 = has_name(this);
    if (bVar1) {
      value_00 = name_abi_cxx11_(this);
      sVar3 = google::protobuf::internal::WireFormatLite::StringSize(value_00);
      sStack_38 = sVar3 + 1 + sStack_38;
    }
    bVar1 = has_share_mode(this);
    if (bVar1) {
      value = share_mode(this);
      sVar3 = google::protobuf::internal::WireFormatLite::EnumSize(value);
      sStack_38 = sVar3 + 1 + sStack_38;
    }
    bVar1 = has_lr_mult(this);
    if (bVar1) {
      sStack_38 = sStack_38 + 5;
    }
    bVar1 = has_decay_mult(this);
    if (bVar1) {
      sStack_38 = sStack_38 + 5;
    }
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_38);
  this->_cached_size_ = iVar2;
  return sStack_38;
}

Assistant:

size_t ParamSpec::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.ParamSpec)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  if (_has_bits_[0 / 32] & 15u) {
    // optional string name = 1;
    if (has_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->name());
    }

    // optional .caffe.ParamSpec.DimCheckMode share_mode = 2;
    if (has_share_mode()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->share_mode());
    }

    // optional float lr_mult = 3 [default = 1];
    if (has_lr_mult()) {
      total_size += 1 + 4;
    }

    // optional float decay_mult = 4 [default = 1];
    if (has_decay_mult()) {
      total_size += 1 + 4;
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}